

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printMemBOption(MCInst *MI,uint OpNum,SStream *O)

{
  uint val_00;
  MCOperand *op;
  int64_t iVar1;
  uint64_t uVar2;
  uint in_ESI;
  MCInst *in_RDI;
  uint val;
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  
  op = MCInst_getOperand(in_RDI,in_ESI);
  iVar1 = MCOperand_getImm(op);
  val_00 = (int)iVar1 + 1;
  uVar2 = ARM_getFeatureBits(in_RDI->csh->mode);
  ARM_MB_MemBOptToString(val_00,(uVar2 & 0x20000000000) != 0);
  SStream_concat0((SStream *)CONCAT44(val_00,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8);
  if (in_RDI->csh->detail != CS_OPT_OFF) {
    (in_RDI->flat_insn->detail->field_6).arm64.operands[0].ext = (int)iVar1 + ARM64_EXT_UXTB;
  }
  return;
}

Assistant:

static void printMemBOption(MCInst *MI, unsigned OpNum, SStream *O)
{
	unsigned val = (unsigned int)MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	SStream_concat0(O, ARM_MB_MemBOptToString(val + 1,
				(ARM_getFeatureBits(MI->csh->mode) & ARM_HasV8Ops) != 0));

	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.mem_barrier = (arm_mem_barrier)(val + 1);
	}
}